

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WeakReferenceDictionary.h
# Opt level: O0

void __thiscall
JsUtil::
SplitWeakDictionary<bool,_Js::RecyclableObject_*,_true,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_RecyclerPointerComparer,_JsUtil::NoResizeLock,_Memory::Recycler>
::Allocate(SplitWeakDictionary<bool,_Js::RecyclableObject_*,_true,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_RecyclerPointerComparer,_JsUtil::NoResizeLock,_Memory::Recycler>
           *this,int **ppBuckets,EntryType **ppEntries,WeakType **ppWeakRefs,uint bucketCount,
          int size)

{
  code *pcVar1;
  bool bVar2;
  int *__s;
  undefined4 *puVar3;
  EntryType *pEVar4;
  WeakType *pWVar5;
  WeakType *newWeakRefs;
  EntryType *newEntries;
  int *newBuckets;
  int size_local;
  uint bucketCount_local;
  WeakType **ppWeakRefs_local;
  EntryType **ppEntries_local;
  int **ppBuckets_local;
  SplitWeakDictionary<bool,_Js::RecyclableObject_*,_true,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_RecyclerPointerComparer,_JsUtil::NoResizeLock,_Memory::Recycler>
  *this_local;
  
  __s = AllocateBuckets(this,bucketCount);
  if (__s == (int *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/WeakReferenceDictionary.h"
                       ,0x2e3,"(newBuckets)","newBuckets");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  pEVar4 = AllocateEntries(this,size,true);
  if (pEVar4 == (EntryType *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/WeakReferenceDictionary.h"
                       ,0x2e6,"(newEntries)","newEntries");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  pWVar5 = AllocateWeakRefs(this,size);
  memset(__s,0xff,(ulong)bucketCount << 2);
  *ppBuckets = __s;
  *ppEntries = pEVar4;
  *ppWeakRefs = pWVar5;
  return;
}

Assistant:

void Allocate(__deref_out_ecount(bucketCount) int** ppBuckets, __deref_out_ecount(size) EntryType** ppEntries, __deref_out_ecount(size) WeakType** ppWeakRefs, DECLSPEC_GUARD_OVERFLOW uint bucketCount, DECLSPEC_GUARD_OVERFLOW int size)
        {
            int *const newBuckets = AllocateBuckets(bucketCount);
            Assert(newBuckets); // no-throw allocators are currently not supported

            EntryType *newEntries = AllocateEntries(size);
            Assert(newEntries); // no-throw allocators are currently not supported

            WeakType * newWeakRefs = AllocateWeakRefs(size);

            memset(newBuckets, -1, bucketCount * sizeof(newBuckets[0]));

            *ppBuckets = newBuckets;
            *ppEntries = newEntries;
            *ppWeakRefs = newWeakRefs;
        }